

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O2

bool __thiscall FSerializer::BeginArray(FSerializer *this,char *name)

{
  FReader *this_00;
  Value *v;
  FJSONObject local_28;
  
  if (this->w == (FWriter *)0x0) {
    v = FReader::FindKey(this->r,name);
    if (v == (Value *)0x0) {
      return false;
    }
    if ((v->data_).f.flags != 4) {
      __assert_fail("val->IsArray()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                    ,0x28b,"bool FSerializer::BeginArray(const char *)");
    }
    this_00 = this->r;
    FJSONObject::FJSONObject(&local_28,v);
    TArray<FJSONObject,_FJSONObject>::Push(&this_00->mObjects,&local_28);
  }
  else {
    WriteKey(this,name);
    FWriter::StartArray(this->w);
    local_28.mObject._0_1_ = 0;
    TArray<bool,_bool>::Push(&this->w->mInObject,(bool *)&local_28);
  }
  return true;
}

Assistant:

bool FSerializer::BeginArray(const char *name)
{
	if (isWriting())
	{
		WriteKey(name);
		w->StartArray();
		w->mInObject.Push(false);
	}
	else
	{
		auto val = r->FindKey(name);
		if (val != nullptr)
		{
			assert(val->IsArray());
			if (val->IsArray())
			{
				r->mObjects.Push(FJSONObject(val));
			}
			else
			{
				Printf(TEXTCOLOR_RED "Array expected for '%s'", name);
				mErrors++;
				return false;
			}
		}
		else
		{
			return false;
		}
	}
	return true;
}